

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

CURLcode Curl_cpool_add_pollfds(cpool *cpool,curl_pollfds *cpfds)

{
  CURLcode CVar1;
  CURLcode result;
  curl_pollfds *cpfds_local;
  cpool *cpool_local;
  
  if (cpool != (cpool *)0x0) {
    if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
      Curl_share_lock(cpool->idata,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
    }
    cpool->field_0x98 = cpool->field_0x98 & 0xfe | 1;
  }
  CVar1 = cpool_add_pollfds(cpool,cpfds);
  if (((cpool != (cpool *)0x0) &&
      (cpool->field_0x98 = cpool->field_0x98 & 0xfe, cpool->share != (Curl_share *)0x0)) &&
     ((cpool->share->specifier & 0x20) != 0)) {
    Curl_share_unlock(cpool->idata,CURL_LOCK_DATA_CONNECT);
  }
  return CVar1;
}

Assistant:

CURLcode Curl_cpool_add_pollfds(struct cpool *cpool,
                                struct curl_pollfds *cpfds)
{
  CURLcode result;
  CPOOL_LOCK(cpool);
  result = cpool_add_pollfds(cpool, cpfds);
  CPOOL_UNLOCK(cpool);
  return result;
}